

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_loadbangabstractions(_glist *x)

{
  int iVar1;
  t_symbol *s_00;
  t_gotfn p_Var2;
  t_symbol *s;
  t_gobj *y;
  _glist *x_local;
  
  s_00 = gensym("loadbang");
  for (s = (t_symbol *)x->gl_list; s != (t_symbol *)0x0; s = (t_symbol *)s->s_thing) {
    if ((_class *)s->s_name == canvas_class) {
      iVar1 = canvas_isabstraction((_glist *)s);
      if (iVar1 == 0) {
        canvas_loadbangabstractions((_glist *)s);
      }
      else {
        canvas_loadbang((_glist *)s);
      }
    }
    else if (((_class *)s->s_name == clone_class) &&
            (p_Var2 = zgetfn((t_pd *)s,s_00), p_Var2 != (t_gotfn)0x0)) {
      pd_vmess((t_pd *)s,s_00,"f",0);
    }
  }
  return;
}

Assistant:

static void canvas_loadbangabstractions(t_canvas *x)
{
    t_gobj *y;
    t_symbol *s = gensym("loadbang");
    for (y = x->gl_list; y; y = y->g_next)
        if (pd_class(&y->g_pd) == canvas_class)
        {
            if (canvas_isabstraction((t_canvas *)y))
                canvas_loadbang((t_canvas *)y);
            else
                canvas_loadbangabstractions((t_canvas *)y);
        }
        else if ((pd_class(&y->g_pd) == clone_class) &&
            zgetfn(&y->g_pd, s))
        {
            pd_vmess(&y->g_pd, s, "f", (t_floatarg)LB_LOAD);
        }
}